

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O0

ssize_t __thiscall
kj::ArrayOutputStream::write(ArrayOutputStream *this,int __fd,void *__buf,size_t __n)

{
  byte *__dest;
  bool bVar1;
  uchar *puVar2;
  uchar *puVar3;
  undefined4 in_register_00000034;
  Fault local_c8;
  Fault f_1;
  unsigned_long *local_b8;
  undefined1 local_b0 [8];
  DebugComparison<unsigned_long_&,_unsigned_long> _kjCondition_1;
  long local_78;
  Fault local_70;
  Fault f;
  unsigned_long *local_60;
  undefined1 local_58 [8];
  DebugComparison<unsigned_long_&,_long> _kjCondition;
  size_t size;
  ArrayOutputStream *this_local;
  ArrayPtr<const_unsigned_char> src_local;
  
  this_local = (ArrayOutputStream *)CONCAT44(in_register_00000034,__fd);
  src_local.ptr = (uchar *)__buf;
  _kjCondition._32_8_ =
       ArrayPtr<const_unsigned_char>::size((ArrayPtr<const_unsigned_char> *)&this_local);
  puVar2 = ArrayPtr<const_unsigned_char>::begin((ArrayPtr<const_unsigned_char> *)&this_local);
  if ((puVar2 == this->fillPos) &&
     (puVar2 = this->fillPos, puVar3 = ArrayPtr<unsigned_char>::end(&this->array), puVar2 != puVar3)
     ) {
    local_60 = (unsigned_long *)
               kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                          (unsigned_long *)&_kjCondition.result);
    puVar2 = ArrayPtr<unsigned_char>::end(&this->array);
    f.exception = (Exception *)(puVar2 + -(long)this->fillPos);
    kj::_::DebugExpression<unsigned_long&>::operator<=
              ((DebugComparison<unsigned_long_&,_long> *)local_58,
               (DebugExpression<unsigned_long&> *)&local_60,(long *)&f);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_58);
    if (bVar1) {
      this->fillPos = this->fillPos + _kjCondition._32_8_;
      return (ssize_t)this;
    }
    puVar2 = ArrayPtr<unsigned_char>::end(&this->array);
    local_78 = (long)puVar2 - (long)this->fillPos;
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,long>&,unsigned_long&,unsigned_char*&,long>
              (&local_70,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/io.c++"
               ,0x116,FAILED,"size <= array.end() - fillPos",
               "_kjCondition,size, fillPos, array.end() - fillPos",
               (DebugComparison<unsigned_long_&,_long> *)local_58,
               (unsigned_long *)&_kjCondition.result,&this->fillPos,&local_78);
    kj::_::Debug::Fault::fatal(&local_70);
  }
  local_b8 = (unsigned_long *)
             kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                        (unsigned_long *)&_kjCondition.result);
  puVar2 = ArrayPtr<unsigned_char>::end(&this->array);
  f_1.exception = (Exception *)(puVar2 + -(long)this->fillPos);
  kj::_::DebugExpression<unsigned_long&>::operator<=
            ((DebugComparison<unsigned_long_&,_unsigned_long> *)local_b0,
             (DebugExpression<unsigned_long&> *)&local_b8,(unsigned_long *)&f_1);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_b0);
  if (bVar1) {
    __dest = this->fillPos;
    puVar2 = ArrayPtr<const_unsigned_char>::begin((ArrayPtr<const_unsigned_char> *)&this_local);
    memcpy(__dest,puVar2,_kjCondition._32_8_);
    this->fillPos = this->fillPos + _kjCondition._32_8_;
    return (ssize_t)this;
  }
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,unsigned_long>&,char_const(&)[77]>
            (&local_c8,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/io.c++"
             ,0x11a,FAILED,"size <= (size_t)(array.end() - fillPos)",
             "_kjCondition,\"ArrayOutputStream\'s backing array was not large enough for the data written.\""
             ,(DebugComparison<unsigned_long_&,_unsigned_long> *)local_b0,
             (char (*) [77])
             "ArrayOutputStream\'s backing array was not large enough for the data written.");
  kj::_::Debug::Fault::fatal(&local_c8);
}

Assistant:

void ArrayOutputStream::write(ArrayPtr<const byte> src) {
  auto size = src.size();
  if (src.begin() == fillPos && fillPos != array.end()) {
    // Oh goody, the caller wrote directly into our buffer.
    KJ_REQUIRE(size <= array.end() - fillPos, size, fillPos, array.end() - fillPos);
    fillPos += size;
  } else {
    KJ_REQUIRE(size <= (size_t)(array.end() - fillPos),
            "ArrayOutputStream's backing array was not large enough for the data written.");
    memcpy(fillPos, src.begin(), size);
    fillPos += size;
  }
}